

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipdir.c
# Opt level: O0

int write_central_dir(FILE *zip,file_sorted_t *filep)

{
  file_entry_t *pfVar1;
  void *__ptr;
  FILE *__stream;
  int iVar2;
  size_t sVar3;
  int *piVar4;
  char *pcVar5;
  file_entry_t *file;
  undefined1 local_48;
  undefined1 local_47;
  CentralDirectoryEntry dir;
  file_sorted_t *filep_local;
  FILE *zip_local;
  
  pfVar1 = filep->file;
  file._2_4_ = 0x2014b50;
  file._6_1_ = 0x14;
  file._7_1_ = 0;
  dir._38_8_ = filep;
  iVar2 = method_to_version((int)pfVar1->method);
  local_48 = (undefined1)iVar2;
  local_47 = 0;
  dir.Magic._0_2_ = 0;
  if (pfVar1->method == 8) {
    dir.Magic._0_2_ = 2;
  }
  dir.Magic._2_2_ = pfVar1->method;
  dir.VersionMadeBy = (BYTE  [2])pfVar1->time;
  dir.VersionToExtract = (BYTE  [2])pfVar1->date;
  dir._8_4_ = pfVar1->crc32;
  dir._12_4_ = pfVar1->compressed_size;
  dir.CRC32 = pfVar1->uncompressed_size;
  sVar3 = strlen(*(char **)(dir._38_8_ + 8));
  dir.CompressedSize._0_2_ = (undefined2)sVar3;
  dir.CompressedSize._2_2_ = 0;
  dir.UncompressedSize._0_2_ = 0;
  dir.UncompressedSize._2_2_ = 0;
  dir.NameLength = 0;
  dir.ExtraLength = 0;
  dir.CommentLength = 0;
  dir._34_4_ = pfVar1->zip_offset;
  sVar3 = fwrite((void *)((long)&file + 2),0x2e,1,(FILE *)zip);
  if (sVar3 == 1) {
    __ptr = *(void **)(dir._38_8_ + 8);
    sVar3 = strlen(*(char **)(dir._38_8_ + 8));
    sVar3 = fwrite(__ptr,sVar3,1,(FILE *)zip);
    if (sVar3 == 1) {
      return 0;
    }
  }
  __stream = _stderr;
  piVar4 = __errno_location();
  pcVar5 = strerror(*piVar4);
  fprintf(__stream,"Error writing central directory header for %s: %s\n",&pfVar1->field_0x26,pcVar5)
  ;
  return 1;
}

Assistant:

int write_central_dir(FILE *zip, file_sorted_t *filep)
{
	CentralDirectoryEntry dir;
	file_entry_t *file;

	file = filep->file;
	dir.Magic = ZIP_CENTRALFILE;
	dir.VersionMadeBy[0] = 20;
	dir.VersionMadeBy[1] = 0;
	dir.VersionToExtract[0] = method_to_version(file->method);
	dir.VersionToExtract[1] = 0;
	dir.Flags = file->method == METHOD_DEFLATE ? LittleShort(2) : 0;
	dir.Method = LittleShort(file->method);
	dir.ModTime = file->time;
	dir.ModDate = file->date;
	dir.CRC32 = file->crc32;
	dir.CompressedSize = LittleLong(file->compressed_size);
	dir.UncompressedSize = LittleLong(file->uncompressed_size);
	dir.NameLength = LittleShort((unsigned short)strlen(filep->path_in_zip));
	dir.ExtraLength = 0;
	dir.CommentLength = 0;
	dir.StartingDiskNumber = 0;
	dir.InternalAttributes = 0;
	dir.ExternalAttributes = 0;
	dir.LocalHeaderOffset = LittleLong(file->zip_offset);

	if (fwrite(&dir, sizeof(dir), 1, zip) != 1 ||
		fwrite(filep->path_in_zip, strlen(filep->path_in_zip), 1, zip) != 1)
	{
		fprintf(stderr, "Error writing central directory header for %s: %s\n", file->path, strerror(errno));
		return 1;
	}
	return 0;
}